

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_test.cpp
# Opt level: O2

void __thiscall
jhu::thrax::TreeTests_TooFewRightParens_Test::TestBody(TreeTests_TooFewRightParens_Test *this)

{
  bool bVar1;
  string_view line;
  AssertHelper local_30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  _Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_> local_20;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    line._M_str = "(ROOT";
    line._M_len = 5;
    readTree((Tree *)&local_20,line);
    std::_Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::~_Vector_base(&local_20)
    ;
  }
  testing::Message::Message((Message *)&local_28);
  testing::internal::AssertHelper::AssertHelper
            (&local_30,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/tree_test.cpp"
             ,0x28,
             "Expected: readTree(\"(ROOT\") throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_28);
  return;
}

Assistant:

TEST(TreeTests, TooFewRightParens) {
 EXPECT_THROW(readTree("(ROOT"), std::invalid_argument);
}